

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O2

int QGregorianCalendar::monthLength(int month,int year)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (0xfffffff3 < month - 0xdU) {
    if (month == 2) {
      bVar1 = leapTest(year);
      return bVar1 | 0x1c;
    }
    uVar2 = (uint)month >> 3 ^ month | 0x1e;
  }
  return uVar2;
}

Assistant:

int QGregorianCalendar::monthLength(int month, int year)
{
    if (month < 1 || month > 12)
        return 0;

    if (month == 2)
        return leapTest(year) ? 29 : 28;

    return 30 | ((month & 1) ^ (month >> 3));
}